

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O0

int main(void)

{
  format_string_t<std::__cxx11::basic_string<char>_> fmt;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_00;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_01;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_02;
  format_string_t<std::__cxx11::basic_string<char>_&> fmt_03;
  string_view delimiter;
  string_view delimiter_00;
  bool bVar1;
  Reddit *pRVar2;
  Index *this;
  Linker *this_00;
  size_type sVar3;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *container;
  Comment *comment_00;
  size_t sVar4;
  exception *e;
  LinkedToken *t;
  iterator __end4;
  iterator __begin4;
  set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *__range4;
  string reply;
  set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> linkedTokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokens;
  Index *index;
  Comment *comment;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Comment,_std::allocator<Comment>_> *__range2;
  vector<Comment,_std::allocator<Comment>_> comments;
  Linker linker;
  set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  allocator<char> *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  char in_stack_fffffffffffffb57;
  LinkedToken *in_stack_fffffffffffffb58;
  Index *in_stack_fffffffffffffb60;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffb70;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *tokens_00;
  Comment *newComment;
  undefined4 in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  duration<long,std::ratio<1l,1l>> local_418 [16];
  string *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  Reddit *in_stack_fffffffffffffc08;
  Comment *in_stack_fffffffffffffc10;
  iterator in_stack_fffffffffffffc18;
  _Self local_3e0;
  undefined1 *local_3d8;
  undefined1 local_3d0 [104];
  Comment *in_stack_fffffffffffffc98;
  string local_360 [32];
  char *local_340;
  Comment *local_338;
  undefined1 local_330 [32];
  Linker *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffd10;
  char *local_2d0;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  char *in_stack_fffffffffffffd48;
  string local_280 [32];
  char *local_260;
  undefined1 local_258 [16];
  string local_248 [32];
  char *local_228;
  undefined1 local_220 [32];
  undefined1 *local_200;
  undefined1 local_1f8 [260];
  undefined4 local_f4;
  char *local_f0;
  char **local_e8;
  char *local_e0;
  char **local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  undefined1 *local_a8;
  char *local_80;
  undefined1 *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char *local_50;
  char **local_48;
  char *local_40;
  char **local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_f4 = 0;
  configureLogger();
  pRVar2 = (Reddit *)operator_new(0x70);
  Reddit::Reddit((Reddit *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  reddit = pRVar2;
  setupSignalHandler();
  loadData();
  spdlog::info<char[13]>((char (*) [13])0x114f6b);
  Linker::Linker(in_stack_fffffffffffffcf0);
  do {
    Reddit::requestNewComments((Reddit *)in_stack_fffffffffffffc18._M_node);
    local_200 = local_1f8;
    local_220._24_8_ =
         std::vector<Comment,_std::allocator<Comment>_>::begin
                   ((vector<Comment,_std::allocator<Comment>_> *)in_stack_fffffffffffffb38);
    local_220._16_8_ =
         std::vector<Comment,_std::allocator<Comment>_>::end
                   ((vector<Comment,_std::allocator<Comment>_> *)in_stack_fffffffffffffb38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                               *)in_stack_fffffffffffffb40,
                              (__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                               *)in_stack_fffffffffffffb38), bVar1) {
      local_220._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>::
           operator*((__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                      *)(local_220 + 0x18));
      local_e8 = &local_228;
      local_f0 = "{}\n\n\n\n\n";
      local_40 = "{}\n\n\n\n\n";
      local_228 = "{}\n\n\n\n\n";
      newComment = (Comment *)local_220;
      local_38 = local_e8;
      this = (Index *)std::char_traits<char>::length((char_type *)0x115068);
      *(Index **)&newComment->id = this;
      local_30 = local_f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58,
                 in_stack_fffffffffffffb57,in_stack_fffffffffffffb48);
      fmt.str_.size_._0_7_ = in_stack_fffffffffffffb50;
      fmt.str_.data_ = (char *)in_stack_fffffffffffffb48;
      fmt.str_.size_._7_1_ = in_stack_fffffffffffffb57;
      spdlog::info<std::__cxx11::string>(fmt,in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)(local_258 + 0xf));
      local_d8 = &local_260;
      local_e0 = "new comment:\n{}";
      local_50 = "new comment:\n{}";
      local_260 = "new comment:\n{}";
      tokens_00 = (set<Token,_std::less<Token>,_std::allocator<Token>_> *)local_258;
      local_48 = local_d8;
      this_00 = (Linker *)std::char_traits<char>::length((char_type *)0x11516c);
      *(Linker **)&(tokens_00->_M_t)._M_impl = this_00;
      local_28 = local_e0;
      Comment::toString_abi_cxx11_(in_stack_fffffffffffffc98);
      fmt_00.str_.size_._0_7_ = in_stack_fffffffffffffb50;
      fmt_00.str_.data_ = (char *)in_stack_fffffffffffffb48;
      fmt_00.str_.size_._7_1_ = in_stack_fffffffffffffb57;
      spdlog::info<std::__cxx11::string>(fmt_00,in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_280);
      getIndex(in_stack_fffffffffffffd10);
      Index::addToIndex(this,newComment);
      lookForBotCommands(in_stack_fffffffffffffc10);
      Comment::extractTokens(in_stack_fffffffffffffc98);
      sVar3 = std::set<Token,_std::less<Token>,_std::allocator<Token>_>::size
                        ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x115248);
      if (sVar3 == 0) {
        spdlog::info<char[21]>((char (*) [21])0x11525e);
        in_stack_fffffffffffffd44 = 5;
      }
      else {
        local_c8 = &local_2d0;
        local_d0 = "tokens in comment: {}";
        local_60 = "tokens in comment: {}";
        local_2d0 = "tokens in comment: {}";
        local_58 = local_c8;
        container = (set<Token,_std::less<Token>,_std::allocator<Token>_> *)
                    std::char_traits<char>::length((char_type *)0x1153bd);
        local_20 = local_d0;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (char *)in_stack_fffffffffffffb48);
        delimiter._M_len._4_4_ = in_stack_fffffffffffffd44;
        delimiter._M_len._0_4_ = in_stack_fffffffffffffd40;
        delimiter._M_str = in_stack_fffffffffffffd48;
        str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>(delimiter,container);
        fmt_01.str_.size_._0_7_ = in_stack_fffffffffffffb50;
        fmt_01.str_.data_ = (char *)in_stack_fffffffffffffb48;
        fmt_01.str_.size_._7_1_ = in_stack_fffffffffffffb57;
        spdlog::info<std::__cxx11::string>(fmt_01,in_stack_fffffffffffffb40);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
        Linker::getLinkedTokens(this_00,tokens_00);
        local_b8 = &local_340;
        local_c0 = "linked tokens: {}";
        local_70 = "linked tokens: {}";
        local_340 = "linked tokens: {}";
        local_68 = local_b8;
        comment_00 = (Comment *)std::char_traits<char>::length((char_type *)0x1154cf);
        local_18 = local_c0;
        local_338 = comment_00;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (char *)in_stack_fffffffffffffb48);
        delimiter_00._M_len._4_4_ = in_stack_fffffffffffffd44;
        delimiter_00._M_len._0_4_ = in_stack_fffffffffffffd40;
        delimiter_00._M_str = in_stack_fffffffffffffd48;
        str::join<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                  (delimiter_00,
                   (set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                   container);
        fmt_02.str_.size_._0_7_ = in_stack_fffffffffffffb50;
        fmt_02.str_.data_ = (char *)in_stack_fffffffffffffb48;
        fmt_02.str_.size_._7_1_ = in_stack_fffffffffffffb57;
        spdlog::info<std::__cxx11::string>(fmt_02,in_stack_fffffffffffffb40);
        std::__cxx11::string::~string(local_360);
        bVar1 = allLinksKnownInThread
                          ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *
                           )in_stack_fffffffffffffb60,(string *)in_stack_fffffffffffffb58);
        if (bVar1) {
          spdlog::info<char[18]>((char (*) [18])0x115592);
          in_stack_fffffffffffffd44 = 5;
        }
        else {
          replyMessage_abi_cxx11_
                    ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                     newComment);
          local_a8 = local_3d0 + 0x30;
          local_b0 = "Possible reply:\n{}";
          local_80 = "Possible reply:\n{}";
          local_3d0._48_8_ = "Possible reply:\n{}";
          in_stack_fffffffffffffb70 = (duration<long,_std::ratio<1L,_1L>_> *)(local_3d0 + 0x38);
          local_78 = local_a8;
          sVar4 = std::char_traits<char>::length((char_type *)0x115688);
          in_stack_fffffffffffffb70->__r = sVar4;
          local_10 = local_b0;
          fmt_03.str_.size_._0_7_ = in_stack_fffffffffffffb50;
          fmt_03.str_.data_ = (char *)in_stack_fffffffffffffb48;
          fmt_03.str_.size_._7_1_ = in_stack_fffffffffffffb57;
          spdlog::info<std::__cxx11::string&>(fmt_03,in_stack_fffffffffffffb40);
          bVar1 = isReplyAllowed(comment_00);
          if (bVar1) {
            in_stack_fffffffffffffb50 = SUB87(reddit,0);
            in_stack_fffffffffffffb57 = (char)((ulong)reddit >> 0x38);
            in_stack_fffffffffffffb58 = (LinkedToken *)(local_220._8_8_ + 0xa0);
            in_stack_fffffffffffffb60 = (Index *)local_3d0;
            std::__cxx11::string::string
                      ((string *)in_stack_fffffffffffffb60,(string *)(local_3d0 + 0x40));
            Reddit::comment(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                            in_stack_fffffffffffffbf8);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)in_stack_fffffffffffffb40);
            std::__cxx11::string::~string((string *)local_3d0);
            spdlog::info<char[11]>((char (*) [11])0x115768);
            local_3d8 = local_330;
            local_3e0._M_node =
                 (_Base_ptr)
                 std::set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>::begin
                           (in_stack_fffffffffffffb38);
            in_stack_fffffffffffffc18 =
                 std::set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>::end
                           (in_stack_fffffffffffffb38);
            while (bVar1 = std::operator!=(&local_3e0,(_Self *)&stack0xfffffffffffffc18), bVar1) {
              in_stack_fffffffffffffc10 =
                   (Comment *)
                   std::_Rb_tree_const_iterator<LinkedToken>::operator*
                             ((_Rb_tree_const_iterator<LinkedToken> *)0x1157cc);
              Index::addToIndex(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
              std::_Rb_tree_const_iterator<LinkedToken>::operator++
                        ((_Rb_tree_const_iterator<LinkedToken> *)in_stack_fffffffffffffb40);
            }
          }
          else {
            spdlog::info<char[15]>((char (*) [15])0x115846);
          }
          std::__cxx11::string::~string((string *)(local_3d0 + 0x40));
          in_stack_fffffffffffffd44 = 0;
        }
        std::set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>::~set
                  ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                   0x11586f);
      }
      std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
                ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x11587c);
      __gnu_cxx::__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
      ::operator++((__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                    *)(local_220 + 0x18));
    }
    std::vector<Comment,_std::allocator<Comment>_>::~vector
              ((vector<Comment,_std::allocator<Comment>_> *)
               CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              (local_418,(int *)&stack0xfffffffffffffbe4);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(in_stack_fffffffffffffb70);
  } while( true );
}

Assistant:

int main() {
    configureLogger();
    reddit = new Reddit();

    setupSignalHandler();

    // debugComment("t1_jbj1if1");

    loadData();

    spdlog::info("Starting bot");

    Linker linker;
    while (true) {
        try {
            const std::vector<Comment> comments = reddit->requestNewComments();

            for (const Comment& comment : comments) {
                spdlog::info("{}\n\n\n\n\n", std::string(40, '-'));

                spdlog::info("new comment:\n{}", comment.toString());
                Index* index = getIndex(comment.threadId);

                index->addToIndex(comment);
                lookForBotCommands(comment);

                const std::set<Token> tokens = comment.extractTokens();
                if (tokens.size() == 0) {
                    spdlog::info("no tokens in comment");
                    continue;
                }

                spdlog::info("tokens in comment: {}", str::join("\n", tokens));

                const std::set<LinkedToken> linkedTokens = linker.getLinkedTokens(tokens);
                spdlog::info("linked tokens: {}", str::join("\n", linkedTokens));

                if (allLinksKnownInThread(linkedTokens, comment.threadId)) {
                    spdlog::info("No tokens to link");
                    continue;
                }

                std::string reply = replyMessage(linkedTokens);
                spdlog::info("Possible reply:\n{}", reply);

                if (isReplyAllowed(comment)) {
                    reddit->comment(comment.fullName, std::move(reply));
                    spdlog::info("Reply sent");

                    for (const LinkedToken& t : linkedTokens) {
                        index->addToIndex(t);
                    }
                } else {
                    spdlog::info("Reply canceled");
                }
            }
        } catch (std::exception& e) {
            spdlog::error("{}\n", e.what());
        } catch (...) {
            spdlog::critical("Catched unknown error!\n");
        }
        std::this_thread::sleep_for(std::chrono::seconds(2));
    }
}